

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

void btSoftBodyHelpers::DrawFrame(btSoftBody *psb,btIDebugDraw *idraw)

{
  long lVar1;
  int i;
  long lVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar3;
  btVector3 x;
  btVector3 com;
  btMatrix3x3 trs;
  btVector3 local_f8;
  btVector3 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  btMatrix3x3 local_60;
  
  if ((psb->m_pose).m_bframe == true) {
    local_d8 = *(undefined8 *)(psb->m_pose).m_com.m_floats;
    uStack_d0 = *(undefined8 *)((psb->m_pose).m_com.m_floats + 2);
    operator*(&local_60,&(psb->m_pose).m_rot,&(psb->m_pose).m_scl);
    local_f8.m_floats[0] = 1.0;
    local_f8.m_floats[1] = 0.0;
    local_f8.m_floats[2] = 0.0;
    local_f8.m_floats[3] = 0.0;
    local_e8 = operator*(&local_60,&local_f8);
    bVar3 = btVector3::normalized(&local_e8);
    local_b8._8_4_ = extraout_XMM0_Dc;
    local_b8._0_8_ = bVar3.m_floats._0_8_;
    local_b8._12_4_ = extraout_XMM0_Dd;
    local_c8._8_4_ = in_XMM1_Dc;
    local_c8._0_8_ = bVar3.m_floats._8_8_;
    local_c8._12_4_ = in_XMM1_Dd;
    local_f8.m_floats[0] = 0.0;
    local_f8.m_floats[1] = 1.0;
    local_f8.m_floats[2] = 0.0;
    local_f8.m_floats[3] = 0.0;
    local_e8 = operator*(&local_60,&local_f8);
    bVar3 = btVector3::normalized(&local_e8);
    local_98._8_4_ = extraout_XMM0_Dc_00;
    local_98._0_8_ = bVar3.m_floats._0_8_;
    local_98._12_4_ = extraout_XMM0_Dd_00;
    local_a8._8_4_ = in_XMM1_Dc;
    local_a8._0_8_ = bVar3.m_floats._8_8_;
    local_a8._12_4_ = in_XMM1_Dd;
    local_f8.m_floats[0] = 0.0;
    local_f8.m_floats[1] = 0.0;
    local_f8.m_floats[2] = 1.0;
    local_f8.m_floats[3] = 0.0;
    local_e8 = operator*(&local_60,&local_f8);
    bVar3 = btVector3::normalized(&local_e8);
    local_78._8_4_ = extraout_XMM0_Dc_01;
    local_78._0_8_ = bVar3.m_floats._0_8_;
    local_78._12_4_ = extraout_XMM0_Dd_01;
    local_88._8_4_ = in_XMM1_Dc;
    local_88._0_8_ = bVar3.m_floats._8_8_;
    local_88._12_4_ = in_XMM1_Dd;
    local_e8.m_floats[1] = (float)((ulong)local_d8 >> 0x20) + (float)local_b8._4_4_ * 10.0;
    local_e8.m_floats[0] = (float)local_d8 + (float)local_b8._0_4_ * 10.0;
    local_e8.m_floats[2] = (float)local_c8._0_4_ * 10.0 + (float)uStack_d0;
    local_e8.m_floats[3] = 0.0;
    local_f8.m_floats[0] = 1.0;
    local_f8.m_floats[1] = 0.0;
    local_f8.m_floats[2] = 0.0;
    local_f8.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_d8,&local_e8,&local_f8);
    local_e8.m_floats[1] = (float)((ulong)local_d8 >> 0x20) + (float)local_98._4_4_ * 10.0;
    local_e8.m_floats[0] = (float)local_d8 + (float)local_98._0_4_ * 10.0;
    local_e8.m_floats[2] = (float)local_a8._0_4_ * 10.0 + (float)uStack_d0;
    local_e8.m_floats[3] = 0.0;
    local_f8.m_floats[0] = 0.0;
    local_f8.m_floats[1] = 1.0;
    local_f8.m_floats[2] = 0.0;
    local_f8.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_d8,&local_e8,&local_f8);
    local_e8.m_floats[1] = (float)((ulong)local_d8 >> 0x20) + (float)local_78._4_4_ * 10.0;
    local_e8.m_floats[0] = (float)local_d8 + (float)local_78._0_4_ * 10.0;
    local_e8.m_floats[2] = (float)local_88._0_4_ * 10.0 + (float)uStack_d0;
    local_e8.m_floats[3] = 0.0;
    local_f8.m_floats[0] = 0.0;
    local_f8.m_floats[1] = 0.0;
    local_f8.m_floats[2] = 1.0;
    local_f8.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_d8,&local_e8,&local_f8);
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < (psb->m_pose).m_pos.m_size; lVar2 = lVar2 + 1) {
      bVar3 = operator*(&local_60,
                        (btVector3 *)((long)((psb->m_pose).m_pos.m_data)->m_floats + lVar1));
      local_e8.m_floats[1] = (float)((ulong)local_d8 >> 0x20) + bVar3.m_floats[1];
      local_e8.m_floats[0] = (float)local_d8 + bVar3.m_floats[0];
      local_e8.m_floats[2] = bVar3.m_floats[2] + (float)uStack_d0;
      local_e8.m_floats[3] = 0.0;
      local_f8.m_floats[0] = 1.0;
      local_f8.m_floats[1] = 0.0;
      local_f8.m_floats[2] = 1.0;
      local_f8.m_floats[3] = 0.0;
      drawVertex(idraw,&local_e8,0.1,&local_f8);
      lVar1 = lVar1 + 0x10;
    }
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::DrawFrame(		btSoftBody* psb,
											 btIDebugDraw* idraw)
{
	if(psb->m_pose.m_bframe)
	{
		static const btScalar	ascl=10;
		static const btScalar	nscl=(btScalar)0.1;
		const btVector3			com=psb->m_pose.m_com;
		const btMatrix3x3		trs=psb->m_pose.m_rot*psb->m_pose.m_scl;
		const btVector3			Xaxis=(trs*btVector3(1,0,0)).normalized();
		const btVector3			Yaxis=(trs*btVector3(0,1,0)).normalized();
		const btVector3			Zaxis=(trs*btVector3(0,0,1)).normalized();
		idraw->drawLine(com,com+Xaxis*ascl,btVector3(1,0,0));
		idraw->drawLine(com,com+Yaxis*ascl,btVector3(0,1,0));
		idraw->drawLine(com,com+Zaxis*ascl,btVector3(0,0,1));
		for(int i=0;i<psb->m_pose.m_pos.size();++i)
		{
			const btVector3	x=com+trs*psb->m_pose.m_pos[i];
			drawVertex(idraw,x,nscl,btVector3(1,0,1));
		}
	}
}